

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O2

double __thiscall Function::getValue(Function *this)

{
  code *pcVar1;
  ostream *poVar2;
  double dVar3;
  string asStack_38 [32];
  
  if (this->bValueValid == false) {
    this->dLastValue = this->dValue;
    pcVar1 = (code *)this->xFunction;
    if (((ulong)pcVar1 & 1) != 0) {
      pcVar1 = *(code **)(pcVar1 + *(long *)((long)(this->super_Physical).physicalUnit.siUnits +
                                            *(long *)&this->field_0xd0 + -0x34) + -1);
    }
    dVar3 = (double)(*pcVar1)();
    this->dValue = dVar3;
    this->bValueValid = true;
  }
  if (this->bVerbose == true) {
    poVar2 = std::ostream::_M_insert<double>(this->dValue);
    poVar2 = std::operator<<(poVar2," <- ");
    (*(this->super_Physical)._vptr_Physical[0xb])(asStack_38,this);
    poVar2 = std::operator<<(poVar2,asStack_38);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string(asStack_38);
  }
  return this->dValue;
}

Assistant:

double Function::getValue() const
{
	if (!bValueValid) {
		dLastValue = dValue;
		dValue = (this->*xFunction)();
		bValueValid = true;
	}
	if (bVerbose)
		(*oLog) << dValue << " <- " << getName() << endl;
	return dValue;
}